

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

value_type_conflict * __thiscall nonstd::optional_bare::optional<char>::value(optional<char> *this)

{
  bool bVar1;
  bad_optional_access *this_00;
  bad_optional_access local_20;
  optional<char> *local_10;
  optional<char> *this_local;
  
  local_10 = this;
  bVar1 = has_value(this);
  if (!bVar1) {
    this_00 = (bad_optional_access *)__cxa_allocate_exception(0x10);
    bad_optional_access::bad_optional_access(&local_20);
    bad_optional_access::bad_optional_access(this_00,&local_20);
    __cxa_throw(this_00,&bad_optional_access::typeinfo,bad_optional_access::~bad_optional_access);
  }
  return &this->value_;
}

Assistant:

value_type const & value() const
    {
#if optional_CONFIG_NO_EXCEPTIONS
        assert( has_value() );
#else
        if ( ! has_value() )
            throw bad_optional_access();
#endif
        return value_;
    }